

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_gradient_v_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color top,rf_color bottom,
          rf_color *dst,rf_int dst_size)

{
  uchar *puVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      puVar1 = &dst->a;
      lVar2 = 0;
      do {
        if (0 < width) {
          fVar4 = (float)lVar2 / (float)height;
          fVar5 = 1.0 - fVar4;
          lVar3 = 0;
          do {
            puVar1[lVar3 * 4 + -3] =
                 (uchar)(int)((float)((uint)bottom & 0xff) * fVar4 +
                             fVar5 * (float)((uint)top & 0xff));
            puVar1[lVar3 * 4 + -2] =
                 (uchar)(int)((float)((uint)bottom >> 8 & 0xff) * fVar4 +
                             fVar5 * (float)((uint)top >> 8 & 0xff));
            puVar1[lVar3 * 4 + -1] =
                 (uchar)(int)((float)((uint)bottom >> 0x10 & 0xff) * fVar4 +
                             fVar5 * (float)((uint)top >> 0x10 & 0xff));
            puVar1[lVar3 * 4] =
                 (uchar)(int)(fVar4 * (float)((uint)bottom >> 0x18) +
                             fVar5 * (float)((uint)top >> 0x18));
            lVar3 = lVar3 + 1;
          } while (width != lVar3);
        }
        lVar2 = lVar2 + 1;
        puVar1 = puVar1 + (long)width * 4;
      } while (lVar2 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_v_to_buffer(int width, int height, rf_color top, rf_color bottom, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int j = 0; j < height; j++)
        {
            float factor = ((float)j) / ((float)height);

            for (rf_int i = 0; i < width; i++)
            {
                ((rf_color*)dst)[j * width + i].r = (int)((float)bottom.r * factor + (float)top.r * (1.f - factor));
                ((rf_color*)dst)[j * width + i].g = (int)((float)bottom.g * factor + (float)top.g * (1.f - factor));
                ((rf_color*)dst)[j * width + i].b = (int)((float)bottom.b * factor + (float)top.b * (1.f - factor));
                ((rf_color*)dst)[j * width + i].a = (int)((float)bottom.a * factor + (float)top.a * (1.f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true
        };
    }

    return result;
}